

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

float SVGChart::GetMaxFromRange(PlotDataBase *inData,long inStartIndex,long inEndIndex)

{
  float fVar1;
  double dVar2;
  long lStack_30;
  float data;
  long theI;
  float fabsMax;
  float max;
  long inEndIndex_local;
  long inStartIndex_local;
  PlotDataBase *inData_local;
  
  theI._4_4_ = 0.0;
  theI._0_4_ = 0.0;
  for (lStack_30 = inStartIndex; lStack_30 <= inEndIndex; lStack_30 = lStack_30 + 1) {
    if (lStack_30 == inStartIndex) {
      theI._4_4_ = PlotDataBase::GetValue(inData,lStack_30);
      dVar2 = std::fabs((double)(ulong)(uint)theI._4_4_);
      theI._0_4_ = SUB84(dVar2,0);
    }
    else {
      fVar1 = PlotDataBase::GetValue(inData,lStack_30);
      dVar2 = std::fabs((double)(ulong)(uint)fVar1);
      if ((float)theI < SUB84(dVar2,0)) {
        dVar2 = std::fabs((double)(ulong)(uint)fVar1);
        theI._0_4_ = SUB84(dVar2,0);
        theI._4_4_ = fVar1;
      }
    }
  }
  return theI._4_4_;
}

Assistant:

float GetMaxFromRange (const PlotDataBase &inData, long inStartIndex, long inEndIndex) {
        float max = 0;
        float fabsMax = 0;
        for (long theI = inStartIndex; theI <= inEndIndex; theI++) {
            if (theI == inStartIndex) {
                max = inData.GetValue (theI);
                fabsMax = fabs (max);
            }
            else {
                float data = inData.GetValue (theI);
                if (fabs (data) > fabsMax) {
                    max = data;
                    fabsMax = fabs (data);
                }
            }
        }

        return max;
    }